

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O1

base_learner * interact_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vw *all_00;
  int iVar2;
  interact *dat;
  ostream *poVar3;
  base_learner *l;
  single_learner *base;
  learner<interact,_example> *plVar4;
  string s;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  _func_int ***local_218;
  _func_int **local_210;
  _func_int **local_208 [2];
  vw *local_1f8;
  long local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  option_group_definition local_1c8;
  string local_190;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_170._0_8_ = (_func_int **)0x27;
  local_218 = local_208;
  local_218 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)local_170);
  local_208[0] = (_func_int **)local_170._0_8_;
  local_218[2] = (_func_int **)0x65736977746e656d;
  local_218[3] = (_func_int **)0x6c7069746c756d20;
  *(undefined4 *)local_218 = 0x65746e49;
  builtin_strncpy((char *)((long)local_218 + 4),"ract",4);
  *(undefined4 *)(local_218 + 1) = 0x61697620;
  builtin_strncpy((char *)((long)local_218 + 0xc)," ele",4);
  builtin_strncpy((char *)((long)local_218 + 0x1f),"lication",8);
  local_210 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_218 + local_170._0_8_) = '\0';
  paVar1 = &local_1c8.m_name.field_2;
  local_1c8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_218,(char *)(local_170._0_8_ + (long)local_218));
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  local_190.field_2._M_allocated_capacity = 0x7463617265746e69;
  local_190._M_string_length = 8;
  local_190.field_2._M_local_buf[8] = '\0';
  local_1f8 = all;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170,&local_190,&local_238);
  local_100 = true;
  local_1f0 = 0x3d;
  local_1e8 = local_1d8;
  local_1e8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1e8,(ulong)&local_1f0);
  local_1d8[0] = local_1f0;
  builtin_strncpy((char *)((long)local_1e8 + 0x2d),"es <n1> ",8);
  builtin_strncpy((char *)((long)local_1e8 + 0x35),"and <n2>",8);
  local_1e8[4] = 0x6d616e206d6f7266;
  local_1e8[5] = 0x2073656361707365;
  local_1e8[2] = 0x7020657275746165;
  local_1e8[3] = 0x2073746375646f72;
  *local_1e8 = 0x6769657720747550;
  local_1e8[1] = 0x66206e6f20737468;
  local_1e0 = local_1f0;
  *(char *)((long)local_1e8 + local_1f0) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1c8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d2050;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  local_170._0_8_ = &PTR__typed_option_002d2050;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1c8);
  local_170._16_8_ = 0x7463617265746e69;
  local_170._8_8_ = (pointer)0x8;
  local_170[0x18] = '\0';
  local_170._0_8_ = local_170 + 0x10;
  iVar2 = (*options->_vptr_options_i[1])(options);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar2 != '\0') {
    if (local_238._M_string_length == 2) {
      dat = calloc_or_throw<interact>(1);
      memset(dat,0,0x88);
      all_00 = local_1f8;
      dat->n1 = *local_238._M_dataplus._M_p;
      dat->n2 = local_238._M_dataplus._M_p[1];
      if (local_1f8->quiet == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Interacting namespaces ",0x17);
        local_170[0] = dat->n1;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_170,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
        local_170[0] = dat->n2;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_170,1);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      dat->all = all_00;
      l = setup_base(options,all_00);
      base = LEARNER::as_singleline<char,char>(l);
      plVar4 = LEARNER::learner<interact,example>::init_learner<LEARNER::learner<char,example>>
                         (dat,base,predict_or_learn<true,true>,predict_or_learn<false,true>,1,
                          *(prediction_type_t *)(base + 0xd0));
      *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
      *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
      *(code **)(plVar4 + 200) = finish;
      goto LAB_001f30bf;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Need two namespace arguments to interact: ",0x2a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," won\'t do EXITING\n",0x12);
  }
  plVar4 = (learner<interact,_example> *)0x0;
LAB_001f30bf:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* interact_setup(options_i& options, vw& all)
{
  string s;
  option_group_definition new_options("Interact via elementwise multiplication");
  new_options.add(
      make_option("interact", s).keep().help("Put weights on feature products from namespaces <n1> and <n2>"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("interact"))
    return nullptr;

  if (s.length() != 2)
  {
    cerr << "Need two namespace arguments to interact: " << s << " won't do EXITING\n";
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<interact>();

  data->n1 = (unsigned char)s[0];
  data->n2 = (unsigned char)s[1];
  if (!all.quiet)
    cerr << "Interacting namespaces " << data->n1 << " and " << data->n2 << endl;
  data->all = &all;

  LEARNER::learner<interact, example>* l;
  l = &LEARNER::init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>, predict_or_learn<false, true>, 1);

  l->set_finish(finish);
  return make_base(*l);
}